

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot.cpp
# Opt level: O2

void __thiscall ImPlotStyle::ImPlotStyle(ImPlotStyle *this)

{
  memset(this->Colors,0,0x180);
  this->LineWeight = 1.0;
  this->Marker = -1;
  this->MarkerSize = 4.0;
  this->MarkerWeight = 1.0;
  this->FillAlpha = 1.0;
  this->ErrorBarSize = 5.0;
  this->ErrorBarWeight = 1.5;
  this->DigitalBitHeight = 8.0;
  this->DigitalBitGap = 4.0;
  this->PlotBorderSize = 1.0;
  this->MinorAlpha = 0.25;
  (this->MajorTickLen).x = 10.0;
  (this->MajorTickLen).y = 10.0;
  (this->MinorTickLen).x = 5.0;
  (this->MinorTickLen).y = 5.0;
  (this->MajorTickSize).x = 1.0;
  (this->MajorTickSize).y = 1.0;
  (this->MinorTickSize).x = 1.0;
  (this->MinorTickSize).y = 1.0;
  (this->MajorGridSize).x = 1.0;
  (this->MajorGridSize).y = 1.0;
  (this->MinorGridSize).x = 1.0;
  (this->MinorGridSize).y = 1.0;
  (this->PlotPadding).x = 10.0;
  (this->PlotPadding).y = 10.0;
  (this->LabelPadding).x = 5.0;
  (this->LabelPadding).y = 5.0;
  (this->LegendPadding).x = 10.0;
  (this->LegendPadding).y = 10.0;
  (this->LegendInnerPadding).x = 5.0;
  (this->LegendInnerPadding).y = 5.0;
  (this->LegendSpacing).x = 0.0;
  (this->LegendSpacing).y = 0.0;
  (this->MousePosPadding).x = 10.0;
  (this->MousePosPadding).y = 10.0;
  (this->AnnotationPadding).x = 2.0;
  (this->AnnotationPadding).y = 2.0;
  (this->PlotDefaultSize).x = 400.0;
  (this->PlotDefaultSize).y = 300.0;
  (this->PlotMinSize).x = 300.0;
  (this->PlotMinSize).y = 225.0;
  ImPlot::StyleColorsAuto(this);
  this->AntiAliasedLines = false;
  this->UseLocalTime = false;
  this->UseISO8601 = false;
  this->Use24HourClock = false;
  return;
}

Assistant:

ImPlotStyle::ImPlotStyle() {

    LineWeight         = 1;
    Marker             = ImPlotMarker_None;
    MarkerSize         = 4;
    MarkerWeight       = 1;
    FillAlpha          = 1;
    ErrorBarSize       = 5;
    ErrorBarWeight     = 1.5f;
    DigitalBitHeight   = 8;
    DigitalBitGap      = 4;

    PlotBorderSize     = 1;
    MinorAlpha         = 0.25f;
    MajorTickLen       = ImVec2(10,10);
    MinorTickLen       = ImVec2(5,5);
    MajorTickSize      = ImVec2(1,1);
    MinorTickSize      = ImVec2(1,1);
    MajorGridSize      = ImVec2(1,1);
    MinorGridSize      = ImVec2(1,1);
    PlotPadding        = ImVec2(10,10);
    LabelPadding       = ImVec2(5,5);
    LegendPadding      = ImVec2(10,10);
    LegendInnerPadding = ImVec2(5,5);
    LegendSpacing      = ImVec2(0,0);
    MousePosPadding    = ImVec2(10,10);
    AnnotationPadding  = ImVec2(2,2);
    PlotDefaultSize    = ImVec2(400,300);
    PlotMinSize        = ImVec2(300,225);

    ImPlot::StyleColorsAuto(this);

    AntiAliasedLines = false;
    UseLocalTime     = false;
    Use24HourClock   = false;
    UseISO8601       = false;
}